

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateSerializeOneField
          (MessageGenerator *this,Printer *printer,FieldDescriptor *field,int cached_has_bits_index)

{
  bool bVar1;
  FieldOptions *pFVar2;
  FieldGenerator *pFVar3;
  Hex hex;
  allocator local_119;
  string local_118;
  string local_f8;
  undefined1 local_d8 [12];
  AlphaNum local_c8;
  undefined1 local_98 [8];
  string mask;
  bool local_6d;
  int has_bit_index;
  bool have_enclosing_if;
  undefined1 local_60 [8];
  Formatter format;
  int cached_has_bits_index_local;
  FieldDescriptor *field_local;
  Printer *printer_local;
  MessageGenerator *this_local;
  AlphaNum *a;
  
  format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = cached_has_bits_index;
  Formatter::Formatter((Formatter *)local_60,printer,&this->variables_);
  pFVar2 = FieldDescriptor::options(field);
  bVar1 = FieldOptions::weak(pFVar2);
  if (!bVar1) {
    PrintFieldComment<google::protobuf::FieldDescriptor>((Formatter *)local_60,field);
  }
  local_6d = false;
  pFVar2 = FieldDescriptor::options(field);
  bVar1 = FieldOptions::weak(pFVar2);
  if (!bVar1) {
    bVar1 = HasHasbit(field);
    if (bVar1) {
      mask.field_2._12_4_ = HasBitIndex(this,field);
      if (format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ ==
          (int)mask.field_2._12_4_ / 0x20) {
        strings::Hex::Hex<unsigned_int>
                  ((Hex *)local_d8,1 << ((byte)mask.field_2._12_4_ & 0x1f),ZERO_PAD_8);
        hex._12_4_ = 0;
        hex.value = local_d8._0_8_;
        hex.spec = local_d8._8_4_;
        strings::AlphaNum::AlphaNum(&local_c8,hex);
        StrCat_abi_cxx11_((string *)local_98,(protobuf *)&local_c8,a);
        Formatter::operator()
                  ((Formatter *)local_60,"if (cached_has_bits & 0x$1$u) {\n",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98);
        std::__cxx11::string::~string((string *)local_98);
      }
      else {
        FieldName_abi_cxx11_
                  (&local_f8,(cpp *)field,
                   (FieldDescriptor *)((long)(int)mask.field_2._12_4_ % 0x20 & 0xffffffff));
        Formatter::operator()((Formatter *)local_60,"if (_internal_has_$1$()) {\n",&local_f8);
        std::__cxx11::string::~string((string *)&local_f8);
      }
      Formatter::Indent((Formatter *)local_60);
      local_6d = true;
    }
    else {
      bVar1 = FieldDescriptor::is_optional(field);
      if ((bVar1) && (bVar1 = HasHasbit(field), !bVar1)) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_118,"this->",&local_119);
        local_6d = anon_unknown_0::EmitFieldNonDefaultCondition(printer,&local_118,field);
        std::__cxx11::string::~string((string *)&local_118);
        std::allocator<char>::~allocator((allocator<char> *)&local_119);
      }
    }
  }
  pFVar3 = FieldGeneratorMap::get(&this->field_generators_,field);
  (*pFVar3->_vptr_FieldGenerator[0x13])(pFVar3,printer);
  if (local_6d != false) {
    Formatter::Outdent((Formatter *)local_60);
    Formatter::operator()<>((Formatter *)local_60,"}\n");
  }
  Formatter::operator()<>((Formatter *)local_60,"\n");
  Formatter::~Formatter((Formatter *)local_60);
  return;
}

Assistant:

void MessageGenerator::GenerateSerializeOneField(io::Printer* printer,
                                                 const FieldDescriptor* field,
                                                 int cached_has_bits_index) {
  Formatter format(printer, variables_);
  if (!field->options().weak()) {
    // For weakfields, PrintFieldComment is called during iteration.
    PrintFieldComment(format, field);
  }

  bool have_enclosing_if = false;
  if (field->options().weak()) {
  } else if (HasHasbit(field)) {
    // Attempt to use the state of cached_has_bits, if possible.
    int has_bit_index = HasBitIndex(field);
    if (cached_has_bits_index == has_bit_index / 32) {
      const std::string mask =
          StrCat(strings::Hex(1u << (has_bit_index % 32), strings::ZERO_PAD_8));

      format("if (cached_has_bits & 0x$1$u) {\n", mask);
    } else {
      format("if (_internal_has_$1$()) {\n", FieldName(field));
    }

    format.Indent();
    have_enclosing_if = true;
  } else if (field->is_optional() && !HasHasbit(field)) {
    have_enclosing_if = EmitFieldNonDefaultCondition(printer, "this->", field);
  }

  field_generators_.get(field).GenerateSerializeWithCachedSizesToArray(printer);

  if (have_enclosing_if) {
    format.Outdent();
    format("}\n");
  }
  format("\n");
}